

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void sync(void)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  char *in_RDI;
  char *pcVar4;
  bool bVar5;
  
  do {
    bVar5 = *in_RDI == '\0';
    if (bVar5) {
LAB_0010589f:
      last_id = t->id;
      bVar3 = false;
      t = get_token();
      eline = t->line;
      ecolumn = t->column;
    }
    else {
      iVar2 = t->id;
      pcVar4 = in_RDI + 1;
      if (iVar2 != *in_RDI && iVar2 != -1) {
        do {
          cVar1 = *pcVar4;
          bVar5 = cVar1 == '\0';
          if (bVar5) goto LAB_0010589f;
          pcVar4 = pcVar4 + 1;
        } while ((iVar2 != -1) && (iVar2 != cVar1));
      }
      bVar3 = true;
      if (bVar5) goto LAB_0010589f;
    }
    if (bVar3) {
      return;
    }
  } while( true );
}

Assistant:

int sync(const char* accepted)
{
    int loop = 1;
    const char* p;
#ifndef NDEBUG
    printf("Trying to resync with one of : ");
    p = accepted;
    while (*p)
    {
        printf("'%c'", *p);
        ++p;
        if (*p)
            printf(", ");
    }
    printf("\n\tLast token : %s\n\tCurrent : %s\n", token_name(last_id), token_name(t->id));
#endif
    while (loop)
    {
        p = accepted;
        while (*p && t->id != EOF && *p != t->id)
            ++p;

        if (*p)
            loop = 0;
        else
            next();
    }
#ifndef NDEBUG
    printf("\tResult: %s found at %d:%d\n", token_name(t->id), t->line, t->column);
#endif
    return *p == t->id;
}